

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  ulong *puVar8;
  ulong uVar9;
  BYTE *pBVar10;
  ulong *puVar11;
  seqDef *psVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  BYTE *pBVar24;
  long lVar25;
  U32 UVar26;
  ulong uVar27;
  uint uVar28;
  U32 UVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong *puVar35;
  ulong *puVar36;
  ulong uVar37;
  BYTE *litEnd;
  ulong *puVar38;
  ulong *puVar39;
  ulong *puVar40;
  BYTE *litLimit_w_12;
  BYTE *litLimit_w_4;
  BYTE *litLimit_w;
  BYTE *litLimit_w_8;
  BYTE *pInLoopLimit_2;
  BYTE *pInLoopLimit_4;
  BYTE *pInLoopLimit;
  BYTE *pInLoopLimit_6;
  ulong local_d8;
  uint local_c8;
  uint local_90;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x1ab,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar28 = (ms->cParams).minMatch;
  uVar32 = (ms->cParams).targetLength;
  pUVar5 = ms->hashTable;
  puVar39 = (ulong *)src;
  if (uVar32 < 2) {
    pBVar6 = (ms->window).base;
    puVar2 = (ulong *)((long)src + srcSize);
    iVar31 = (int)pBVar6;
    iVar21 = (int)puVar2 - iVar31;
    uVar32 = (ms->window).dictLimit;
    uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar23 = iVar21 - uVar15;
    if (iVar21 - uVar32 <= uVar15) {
      uVar23 = uVar32;
    }
    if (ms->loadedDictEnd != 0) {
      uVar23 = uVar32;
    }
    pBVar24 = pBVar6 + uVar23;
    puVar38 = (ulong *)((long)src + (ulong)(pBVar24 == (BYTE *)src));
    iVar21 = (int)puVar38 - iVar31;
    uVar14 = iVar21 - uVar15;
    if (iVar21 - uVar32 <= uVar15) {
      uVar14 = uVar32;
    }
    uVar15 = *rep;
    uVar22 = rep[1];
    if (ms->loadedDictEnd != 0) {
      uVar14 = uVar32;
    }
    uVar14 = iVar21 - uVar14;
    local_c8 = uVar22;
    if (uVar14 < uVar22) {
      local_c8 = 0;
    }
    uVar32 = 0;
    if (uVar15 <= uVar14) {
      uVar32 = uVar15;
    }
    uVar37 = (ulong)uVar32;
    puVar36 = (ulong *)((long)src + (srcSize - 8));
    puVar8 = (ulong *)((long)src + (ulong)(pBVar24 == (BYTE *)src) + 3);
    if (uVar28 == 5) {
      if (puVar8 < puVar36) {
        uVar28 = (ms->cParams).hashLog;
        if (0x20 < uVar28) goto LAB_001cf727;
        bVar13 = 0x40 - (char)uVar28;
        puVar16 = (ulong *)((long)puVar2 - 7);
        puVar1 = puVar2 + -4;
        do {
          puVar17 = puVar38 + 0x10;
          uVar34 = *puVar38 * -0x30e4432345000000 >> (bVar13 & 0x3f);
          uVar20 = *(ulong *)((long)puVar38 + 1);
          uVar28 = pUVar5[uVar34];
          uVar32 = (uint)uVar37;
          lVar30 = -uVar37;
          uVar27 = 2;
          puVar35 = (ulong *)((long)puVar38 + 2);
          puVar40 = (ulong *)((long)puVar38 + 1);
          while( true ) {
            puVar11 = puVar8;
            uVar20 = uVar20 * -0x30e4432345000000 >> (bVar13 & 0x3f);
            UVar29 = (int)puVar38 - iVar31;
            iVar21 = *(int *)((long)puVar35 + lVar30);
            pUVar5[uVar34] = UVar29;
            if ((uVar32 != 0) && ((int)*puVar35 == iVar21)) {
              uVar27 = (ulong)(*(char *)((long)puVar35 - 1) ==
                              *(char *)((long)puVar35 + lVar30 + -1));
              puVar38 = (ulong *)((long)puVar35 - uVar27);
              pBVar10 = (BYTE *)((long)puVar35 + (lVar30 - uVar27));
              uVar27 = uVar27 | 4;
              pUVar5[uVar20] = (int)puVar40 - iVar31;
              UVar26 = 1;
              uVar20 = uVar37;
              uVar37 = (ulong)local_c8;
              goto LAB_001cdfb3;
            }
            if ((uVar23 <= uVar28) &&
               (uVar33 = (ulong)uVar28, puVar8 = puVar40, (int)*puVar38 == *(int *)(pBVar6 + uVar33)
               )) goto LAB_001ce065;
            uVar28 = pUVar5[uVar20];
            uVar33 = (ulong)uVar28;
            uVar34 = *puVar35 * -0x30e4432345000000 >> (bVar13 & 0x3f);
            UVar29 = (int)puVar40 - iVar31;
            pUVar5[uVar20] = UVar29;
            if ((uVar23 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar33))) break;
            uVar28 = pUVar5[uVar34];
            puVar40 = (ulong *)(uVar27 + (long)puVar35);
            uVar33 = uVar27;
            if (puVar17 <= puVar40) {
              puVar17 = puVar17 + 0x10;
              uVar33 = uVar27 + 1;
            }
            uVar20 = *puVar11;
            puVar8 = (ulong *)(uVar27 + (long)puVar11);
            puVar38 = puVar35;
            uVar27 = uVar33;
            puVar35 = puVar40;
            puVar40 = puVar11;
            if (puVar36 <= puVar8) goto LAB_001cf5f5;
          }
          puVar8 = puVar35;
          uVar20 = uVar34;
          puVar38 = puVar40;
          if (uVar27 < 5) {
LAB_001ce065:
            pUVar5[uVar20] = (int)puVar8 - iVar31;
          }
          pBVar10 = pBVar6 + uVar33;
          uVar32 = (int)puVar38 - (int)pBVar10;
          uVar20 = (ulong)uVar32;
          if (uVar32 == 0) goto LAB_001cf765;
          UVar26 = uVar32 + 3;
          uVar27 = 4;
          if ((uVar23 < uVar28) && (puVar39 < puVar38)) {
            pBVar3 = pBVar6 + (uVar33 - 1);
            puVar8 = puVar38;
            while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar8 + -1),
                  *(BYTE *)puVar38 == *pBVar10) {
              uVar27 = uVar27 + 1;
              if ((puVar38 <= puVar39) ||
                 (pBVar3 = pBVar10 + -1, puVar8 = puVar38, pBVar10 <= pBVar24)) goto LAB_001cdfb3;
            }
            pBVar10 = pBVar10 + 1;
            puVar38 = puVar8;
          }
LAB_001cdfb3:
          puVar8 = (ulong *)((long)puVar38 + uVar27);
          puVar17 = (ulong *)(pBVar10 + uVar27);
          puVar35 = puVar8;
          if (puVar8 < puVar16) {
            if (*puVar17 == *puVar8) {
              lVar30 = 0;
              do {
                puVar17 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                if (puVar16 <= puVar17) {
                  puVar17 = (ulong *)(pBVar10 + lVar30 + uVar27 + 8);
                  puVar35 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                  goto LAB_001ce10d;
                }
                lVar25 = lVar30 + uVar27 + 8;
                uVar34 = *puVar17;
                lVar30 = lVar30 + 8;
              } while (*(ulong *)(pBVar10 + lVar25) == uVar34);
              uVar34 = uVar34 ^ *(ulong *)(pBVar10 + lVar25);
              uVar33 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar34 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
            }
            else {
              uVar33 = *puVar8 ^ *puVar17;
              uVar34 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar34 = uVar34 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001ce10d:
            if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar35 < puVar2) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar17 == (char)*puVar35));
            }
            uVar34 = (long)puVar35 - (long)puVar8;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001cf6ca;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
          uVar33 = (long)puVar38 - (long)puVar39;
          puVar8 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar8 + uVar33))
          goto LAB_001cf64e;
          if (puVar2 < puVar38) goto LAB_001cf66d;
          if (puVar1 < puVar38) {
            ZSTD_safecopyLiterals((BYTE *)puVar8,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar1);
LAB_001ce1d3:
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar9 = puVar39[1];
            *puVar8 = *puVar39;
            puVar8[1] = uVar9;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar33) {
              if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) <
                  0xffffffffffffffe1) {
                uVar9 = puVar39[3];
                *(ulong *)(pBVar10 + 0x10) = puVar39[2];
                *(ulong *)(pBVar10 + 0x18) = uVar9;
                if (0x20 < (long)uVar33) {
                  lVar30 = 0;
                  do {
                    puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                    uVar7 = puVar4[1];
                    pBVar3 = pBVar10 + lVar30 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar4;
                    *(undefined8 *)(pBVar3 + 8) = uVar7;
                    puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                    uVar7 = puVar4[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                    lVar30 = lVar30 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar10 + uVar33);
                }
                goto LAB_001ce1d3;
              }
              goto LAB_001cf7a3;
            }
            seqStore->lit = pBVar10 + uVar33;
          }
          uVar34 = uVar34 + uVar27;
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar33;
          psVar12->offBase = UVar26;
          if (uVar34 < 3) goto LAB_001cf6ab;
          if (0xffff < uVar34 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->mlBase = (U16)(uVar34 - 3);
          psVar12 = psVar12 + 1;
          seqStore->sequences = psVar12;
          puVar39 = (ulong *)((long)puVar38 + uVar34);
          local_c8 = (uint)uVar37;
          if (puVar39 <= puVar36) {
            if (pBVar6 + (ulong)UVar29 + 2 <= src) goto LAB_001cf746;
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)UVar29 + 2) * -0x30e4432345000000) >>
                   (bVar13 & 0x3f)] = UVar29 + 2;
            pUVar5[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e4432345000000) >> (bVar13 & 0x3f)]
                 = ((int)puVar39 + -2) - iVar31;
            uVar27 = uVar20;
            if (local_c8 == 0) {
              local_c8 = 0;
            }
            else {
              do {
                uVar20 = uVar37;
                if ((int)*puVar39 != *(int *)((long)puVar39 - uVar20)) {
                  local_c8 = (uint)uVar20;
                  uVar20 = uVar27;
                  break;
                }
                lVar30 = -uVar20;
                puVar38 = (ulong *)((long)puVar39 + 4);
                puVar17 = (ulong *)((long)puVar39 + lVar30 + 4);
                puVar8 = puVar38;
                if (puVar38 < puVar16) {
                  if (*puVar17 == *puVar38) {
                    lVar25 = 0;
                    do {
                      puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                      if (puVar16 <= puVar8) {
                        puVar17 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                        puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                        goto LAB_001ce3ea;
                      }
                      uVar37 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                      uVar34 = *puVar8;
                      lVar25 = lVar25 + 8;
                    } while (uVar37 == uVar34);
                    uVar34 = uVar34 ^ uVar37;
                    uVar37 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar34 = *puVar38 ^ *puVar17;
                    uVar37 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    uVar37 = uVar37 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001ce3ea:
                  if ((puVar8 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar8)) {
                    puVar8 = (ulong *)((long)puVar8 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar8 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar8)
                     ) {
                    puVar8 = (ulong *)((long)puVar8 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar8 < puVar2) {
                    puVar8 = (ulong *)((long)puVar8 + (ulong)((char)*puVar17 == (char)*puVar8));
                  }
                  uVar37 = (long)puVar8 - (long)puVar38;
                }
                pUVar5[*puVar39 * -0x30e4432345000000 >> (bVar13 & 0x3f)] = (int)puVar39 - iVar31;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3)) goto LAB_001cf6ca;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
                puVar38 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
                if (puVar2 < puVar39) goto LAB_001cf66d;
                if (puVar1 < puVar39) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
                }
                else {
                  uVar34 = puVar39[1];
                  *puVar38 = *puVar39;
                  puVar38[1] = uVar34;
                }
                local_c8 = (uint)uVar27;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offBase = 1;
                if (uVar37 + 4 < 3) goto LAB_001cf6ab;
                if (0xffff < uVar37 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar39 = (ulong *)((long)puVar39 + uVar37 + 4);
                psVar12->mlBase = (U16)(uVar37 + 1);
                psVar12 = psVar12 + 1;
                seqStore->sequences = psVar12;
                uVar37 = uVar27;
                uVar27 = uVar20;
              } while (puVar39 <= puVar36);
            }
          }
          puVar8 = (ulong *)((long)puVar39 + 3);
          uVar32 = (uint)uVar20;
          uVar37 = uVar20;
          puVar38 = puVar39;
        } while (puVar8 < puVar36);
      }
LAB_001cf5f5:
      if (uVar22 <= uVar14) {
        uVar22 = 0;
      }
      uVar28 = uVar22;
      if (uVar32 != 0) {
        uVar28 = uVar15;
      }
      if (uVar15 <= uVar14) {
        uVar28 = uVar22;
        uVar15 = 0;
      }
      if (uVar32 != 0) {
        uVar15 = uVar32;
      }
    }
    else {
      if (uVar28 == 6) {
        if (puVar8 < puVar36) {
          uVar28 = (ms->cParams).hashLog;
          if (0x20 < uVar28) goto LAB_001cf727;
          bVar13 = 0x40 - (char)uVar28;
          puVar16 = (ulong *)((long)puVar2 - 7);
          puVar1 = puVar2 + -4;
          do {
            puVar17 = puVar38 + 0x10;
            uVar34 = *puVar38 * -0x30e4432340650000 >> (bVar13 & 0x3f);
            uVar20 = *(ulong *)((long)puVar38 + 1);
            uVar28 = pUVar5[uVar34];
            uVar32 = (uint)uVar37;
            lVar30 = -uVar37;
            uVar27 = 2;
            puVar35 = (ulong *)((long)puVar38 + 2);
            puVar40 = (ulong *)((long)puVar38 + 1);
            while( true ) {
              puVar11 = puVar8;
              uVar20 = uVar20 * -0x30e4432340650000 >> (bVar13 & 0x3f);
              uVar19 = (int)puVar38 - iVar31;
              iVar21 = *(int *)((long)puVar35 + lVar30);
              pUVar5[uVar34] = uVar19;
              if ((uVar32 != 0) && ((int)*puVar35 == iVar21)) {
                uVar27 = (ulong)(*(char *)((long)puVar35 - 1) ==
                                *(char *)((long)puVar35 + lVar30 + -1));
                puVar38 = (ulong *)((long)puVar35 - uVar27);
                pBVar10 = (BYTE *)((long)puVar35 + (lVar30 - uVar27));
                uVar27 = uVar27 | 4;
                pUVar5[uVar20] = (int)puVar40 - iVar31;
                UVar29 = 1;
                uVar20 = uVar37;
                uVar37 = (ulong)local_c8;
                goto LAB_001cd037;
              }
              if ((uVar23 <= uVar28) &&
                 (uVar33 = (ulong)uVar28, puVar8 = puVar40,
                 (int)*puVar38 == *(int *)(pBVar6 + uVar33))) goto LAB_001cd0f0;
              uVar28 = pUVar5[uVar20];
              uVar33 = (ulong)uVar28;
              uVar34 = *puVar35 * -0x30e4432340650000 >> (bVar13 & 0x3f);
              uVar19 = (int)puVar40 - iVar31;
              pUVar5[uVar20] = uVar19;
              if ((uVar23 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar33))) break;
              uVar28 = pUVar5[uVar34];
              puVar40 = (ulong *)((long)puVar35 + uVar27);
              uVar33 = uVar27;
              if (puVar17 <= puVar40) {
                puVar17 = puVar17 + 0x10;
                uVar33 = uVar27 + 1;
              }
              uVar20 = *puVar11;
              puVar8 = (ulong *)(uVar27 + (long)puVar11);
              puVar38 = puVar35;
              uVar27 = uVar33;
              puVar35 = puVar40;
              puVar40 = puVar11;
              if (puVar36 <= puVar8) goto LAB_001cf4ea;
            }
            puVar8 = puVar35;
            uVar20 = uVar34;
            puVar38 = puVar40;
            if (uVar27 < 5) {
LAB_001cd0f0:
              pUVar5[uVar20] = (int)puVar8 - iVar31;
            }
            pBVar10 = pBVar6 + uVar33;
            uVar32 = (int)puVar38 - (int)pBVar10;
            uVar20 = (ulong)uVar32;
            if (uVar32 == 0) goto LAB_001cf765;
            UVar29 = uVar32 + 3;
            uVar27 = 4;
            if ((uVar23 < uVar28) && (puVar39 < puVar38)) {
              pBVar3 = pBVar6 + (uVar33 - 1);
              puVar8 = puVar38;
              while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar8 + -1),
                    *(BYTE *)puVar38 == *pBVar10) {
                uVar27 = uVar27 + 1;
                if ((puVar38 <= puVar39) ||
                   (pBVar3 = pBVar10 + -1, puVar8 = puVar38, pBVar10 <= pBVar24)) goto LAB_001cd037;
              }
              pBVar10 = pBVar10 + 1;
              puVar38 = puVar8;
            }
LAB_001cd037:
            puVar8 = (ulong *)((long)puVar38 + uVar27);
            puVar17 = (ulong *)(pBVar10 + uVar27);
            puVar35 = puVar8;
            if (puVar8 < puVar16) {
              if (*puVar17 == *puVar8) {
                lVar30 = 0;
                do {
                  puVar17 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                  if (puVar16 <= puVar17) {
                    puVar17 = (ulong *)(pBVar10 + lVar30 + uVar27 + 8);
                    puVar35 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                    goto LAB_001cd1a0;
                  }
                  lVar25 = lVar30 + uVar27 + 8;
                  uVar34 = *puVar17;
                  lVar30 = lVar30 + 8;
                } while (*(ulong *)(pBVar10 + lVar25) == uVar34);
                uVar34 = uVar34 ^ *(ulong *)(pBVar10 + lVar25);
                uVar33 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar34 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
              }
              else {
                uVar33 = *puVar8 ^ *puVar17;
                uVar34 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar34 = uVar34 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001cd1a0:
              if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar17 = (ulong *)((long)puVar17 + 4);
              }
              if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar35))
              {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar17 = (ulong *)((long)puVar17 + 2);
              }
              if (puVar35 < puVar2) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar17 == (char)*puVar35));
              }
              uVar34 = (long)puVar35 - (long)puVar8;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001cf6ca;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
            uVar33 = (long)puVar38 - (long)puVar39;
            puVar8 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar8 + uVar33))
            goto LAB_001cf64e;
            if (puVar2 < puVar38) goto LAB_001cf66d;
            if (puVar1 < puVar38) {
              ZSTD_safecopyLiterals((BYTE *)puVar8,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar1);
LAB_001cd266:
              seqStore->lit = seqStore->lit + uVar33;
              if (0xffff < uVar33) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
            }
            else {
              uVar9 = puVar39[1];
              *puVar8 = *puVar39;
              puVar8[1] = uVar9;
              pBVar10 = seqStore->lit;
              if (0x10 < uVar33) {
                if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) <
                    0xffffffffffffffe1) {
                  uVar9 = puVar39[3];
                  *(ulong *)(pBVar10 + 0x10) = puVar39[2];
                  *(ulong *)(pBVar10 + 0x18) = uVar9;
                  if (0x20 < (long)uVar33) {
                    lVar30 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                      uVar7 = puVar4[1];
                      pBVar3 = pBVar10 + lVar30 + 0x20;
                      *(undefined8 *)pBVar3 = *puVar4;
                      *(undefined8 *)(pBVar3 + 8) = uVar7;
                      puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                      uVar7 = puVar4[1];
                      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                      lVar30 = lVar30 + 0x20;
                    } while (pBVar3 + 0x20 < pBVar10 + uVar33);
                  }
                  goto LAB_001cd266;
                }
                goto LAB_001cf7a3;
              }
              seqStore->lit = pBVar10 + uVar33;
            }
            uVar34 = uVar34 + uVar27;
            psVar12 = seqStore->sequences;
            psVar12->litLength = (U16)uVar33;
            psVar12->offBase = UVar29;
            if (uVar34 < 3) goto LAB_001cf6ab;
            if (0xffff < uVar34 - 3) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->mlBase = (U16)(uVar34 - 3);
            psVar12 = psVar12 + 1;
            seqStore->sequences = psVar12;
            puVar39 = (ulong *)((long)puVar38 + uVar34);
            local_c8 = (uint)uVar37;
            if (puVar39 <= puVar36) {
              if (pBVar6 + (ulong)uVar19 + 2 <= src) goto LAB_001cf746;
              pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar19 + 2) * -0x30e4432340650000) >>
                     (bVar13 & 0x3f)] = uVar19 + 2;
              pUVar5[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e4432340650000) >> (bVar13 & 0x3f)
                    ] = ((int)puVar39 + -2) - iVar31;
              uVar27 = uVar20;
              if (local_c8 == 0) {
                local_c8 = 0;
              }
              else {
                do {
                  uVar20 = uVar37;
                  if ((int)*puVar39 != *(int *)((long)puVar39 - uVar20)) {
                    local_c8 = (uint)uVar20;
                    uVar20 = uVar27;
                    break;
                  }
                  lVar30 = -uVar20;
                  puVar38 = (ulong *)((long)puVar39 + 4);
                  puVar17 = (ulong *)((long)puVar39 + lVar30 + 4);
                  puVar8 = puVar38;
                  if (puVar38 < puVar16) {
                    if (*puVar17 == *puVar38) {
                      lVar25 = 0;
                      do {
                        puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                        if (puVar16 <= puVar8) {
                          puVar17 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                          puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                          goto LAB_001cd47d;
                        }
                        uVar37 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                        uVar34 = *puVar8;
                        lVar25 = lVar25 + 8;
                      } while (uVar37 == uVar34);
                      uVar34 = uVar34 ^ uVar37;
                      uVar37 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar25;
                    }
                    else {
                      uVar34 = *puVar38 ^ *puVar17;
                      uVar37 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = uVar37 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_001cd47d:
                    if ((puVar8 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar8))
                    {
                      puVar8 = (ulong *)((long)puVar8 + 4);
                      puVar17 = (ulong *)((long)puVar17 + 4);
                    }
                    if ((puVar8 < (ulong *)((long)puVar2 - 1U)) &&
                       ((short)*puVar17 == (short)*puVar8)) {
                      puVar8 = (ulong *)((long)puVar8 + 2);
                      puVar17 = (ulong *)((long)puVar17 + 2);
                    }
                    if (puVar8 < puVar2) {
                      puVar8 = (ulong *)((long)puVar8 + (ulong)((char)*puVar17 == (char)*puVar8));
                    }
                    uVar37 = (long)puVar8 - (long)puVar38;
                  }
                  pUVar5[*puVar39 * -0x30e4432340650000 >> (bVar13 & 0x3f)] = (int)puVar39 - iVar31;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3))
                  goto LAB_001cf6ca;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
                  puVar38 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
                  if (puVar2 < puVar39) goto LAB_001cf66d;
                  if (puVar1 < puVar39) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
                  }
                  else {
                    uVar34 = puVar39[1];
                    *puVar38 = *puVar39;
                    puVar38[1] = uVar34;
                  }
                  local_c8 = (uint)uVar27;
                  psVar12 = seqStore->sequences;
                  psVar12->litLength = 0;
                  psVar12->offBase = 1;
                  if (uVar37 + 4 < 3) goto LAB_001cf6ab;
                  if (0xffff < uVar37 + 1) {
                    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                    seqStore->longLengthType = ZSTD_llt_matchLength;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                  }
                  puVar39 = (ulong *)((long)puVar39 + uVar37 + 4);
                  psVar12->mlBase = (U16)(uVar37 + 1);
                  psVar12 = psVar12 + 1;
                  seqStore->sequences = psVar12;
                  uVar37 = uVar27;
                  uVar27 = uVar20;
                } while (puVar39 <= puVar36);
              }
            }
            puVar8 = (ulong *)((long)puVar39 + 3);
            uVar32 = (uint)uVar20;
            uVar37 = uVar20;
            puVar38 = puVar39;
          } while (puVar8 < puVar36);
        }
      }
      else {
        if (uVar28 != 7) {
          if (puVar8 < puVar36) {
            uVar28 = (ms->cParams).hashLog;
            iVar21 = uVar28 - 0x20;
            if (0x1f < uVar28 && iVar21 != 0) goto LAB_001cf727;
            bVar13 = -(char)iVar21;
            puVar16 = (ulong *)((long)puVar2 - 7);
            puVar1 = puVar2 + -4;
            do {
              uVar32 = (uint)uVar37;
              puVar17 = puVar38 + 0x10;
              uVar27 = (ulong)((uint)((int)*puVar38 * -0x61c8864f) >> (bVar13 & 0x1f));
              iVar21 = *(int *)((long)puVar38 + 1);
              uVar28 = pUVar5[uVar27];
              lVar30 = -uVar37;
              uVar20 = 2;
              puVar35 = (ulong *)((long)puVar38 + 2);
              puVar40 = (ulong *)((long)puVar38 + 1);
              while( true ) {
                puVar11 = puVar8;
                uVar34 = (ulong)((uint)(iVar21 * -0x61c8864f) >> (bVar13 & 0x1f));
                UVar29 = (int)puVar38 - iVar31;
                iVar21 = *(int *)((long)puVar35 + lVar30);
                pUVar5[uVar27] = UVar29;
                if ((uVar32 != 0) && ((int)*puVar35 == iVar21)) {
                  uVar27 = (ulong)(*(char *)((long)puVar35 - 1) ==
                                  *(char *)((long)puVar35 + lVar30 + -1));
                  puVar38 = (ulong *)((long)puVar35 - uVar27);
                  pBVar10 = (BYTE *)((long)puVar35 + (lVar30 - uVar27));
                  uVar27 = uVar27 | 4;
                  pUVar5[uVar34] = (int)puVar40 - iVar31;
                  UVar26 = 1;
                  uVar20 = uVar37;
                  uVar37 = (ulong)local_c8;
                  goto LAB_001ceed4;
                }
                if ((uVar23 <= uVar28) &&
                   (uVar33 = (ulong)uVar28, puVar8 = puVar40,
                   (int)*puVar38 == *(int *)(pBVar6 + uVar33))) goto LAB_001cef8f;
                uVar28 = pUVar5[uVar34];
                uVar33 = (ulong)uVar28;
                uVar27 = (ulong)((uint)((int)*puVar35 * -0x61c8864f) >> (bVar13 & 0x1f));
                UVar29 = (int)puVar40 - iVar31;
                pUVar5[uVar34] = UVar29;
                if ((uVar23 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar33))) break;
                uVar28 = pUVar5[uVar27];
                puVar40 = (ulong *)((long)puVar35 + uVar20);
                uVar34 = uVar20;
                if (puVar17 <= puVar40) {
                  puVar17 = puVar17 + 0x10;
                  uVar34 = uVar20 + 1;
                }
                iVar21 = (int)*puVar11;
                puVar8 = (ulong *)(uVar20 + (long)puVar11);
                uVar20 = uVar34;
                puVar38 = puVar35;
                puVar35 = puVar40;
                puVar40 = puVar11;
                if (puVar36 <= puVar8) goto LAB_001cf5f5;
              }
              puVar8 = puVar35;
              uVar34 = uVar27;
              puVar38 = puVar40;
              if (uVar20 < 5) {
LAB_001cef8f:
                pUVar5[uVar34] = (int)puVar8 - iVar31;
              }
              pBVar10 = pBVar6 + uVar33;
              uVar32 = (int)puVar38 - (int)pBVar10;
              uVar20 = (ulong)uVar32;
              if (uVar32 == 0) goto LAB_001cf765;
              UVar26 = uVar32 + 3;
              uVar27 = 4;
              if ((uVar23 < uVar28) && (puVar39 < puVar38)) {
                pBVar3 = pBVar6 + (uVar33 - 1);
                puVar8 = puVar38;
                while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar8 + -1),
                      *(BYTE *)puVar38 == *pBVar10) {
                  uVar27 = uVar27 + 1;
                  if ((puVar38 <= puVar39) ||
                     (pBVar3 = pBVar10 + -1, puVar8 = puVar38, pBVar10 <= pBVar24))
                  goto LAB_001ceed4;
                }
                pBVar10 = pBVar10 + 1;
                puVar38 = puVar8;
              }
LAB_001ceed4:
              puVar8 = (ulong *)((long)puVar38 + uVar27);
              puVar17 = (ulong *)(pBVar10 + uVar27);
              puVar35 = puVar8;
              if (puVar8 < puVar16) {
                if (*puVar17 == *puVar8) {
                  lVar30 = 0;
                  do {
                    puVar17 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                    if (puVar16 <= puVar17) {
                      puVar17 = (ulong *)(pBVar10 + lVar30 + uVar27 + 8);
                      puVar35 = (ulong *)((long)puVar38 + lVar30 + 8 + uVar27);
                      goto LAB_001cf052;
                    }
                    lVar25 = lVar30 + uVar27 + 8;
                    uVar34 = *puVar17;
                    lVar30 = lVar30 + 8;
                  } while (*(ulong *)(pBVar10 + lVar25) == uVar34);
                  uVar34 = uVar34 ^ *(ulong *)(pBVar10 + lVar25);
                  uVar33 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  uVar34 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
                }
                else {
                  uVar33 = *puVar8 ^ *puVar17;
                  uVar34 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar34 = uVar34 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001cf052:
                if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar17 = (ulong *)((long)puVar17 + 4);
                }
                if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar35)
                   ) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar17 = (ulong *)((long)puVar17 + 2);
                }
                if (puVar35 < puVar2) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar17 == (char)*puVar35));
                }
                uVar34 = (long)puVar35 - (long)puVar8;
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001cf6ca;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
              uVar33 = (long)puVar38 - (long)puVar39;
              puVar8 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar8 + uVar33))
              goto LAB_001cf64e;
              if (puVar2 < puVar38) goto LAB_001cf66d;
              if (puVar1 < puVar38) {
                ZSTD_safecopyLiterals((BYTE *)puVar8,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar1)
                ;
LAB_001cf115:
                seqStore->lit = seqStore->lit + uVar33;
                if (0xffff < uVar33) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
                  seqStore->longLengthType = ZSTD_llt_literalLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                uVar9 = puVar39[1];
                *puVar8 = *puVar39;
                puVar8[1] = uVar9;
                pBVar10 = seqStore->lit;
                if (0x10 < uVar33) {
                  if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) <
                      0xffffffffffffffe1) {
                    uVar9 = puVar39[3];
                    *(ulong *)(pBVar10 + 0x10) = puVar39[2];
                    *(ulong *)(pBVar10 + 0x18) = uVar9;
                    if (0x20 < (long)uVar33) {
                      lVar30 = 0;
                      do {
                        puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                        uVar7 = puVar4[1];
                        pBVar3 = pBVar10 + lVar30 + 0x20;
                        *(undefined8 *)pBVar3 = *puVar4;
                        *(undefined8 *)(pBVar3 + 8) = uVar7;
                        puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                        uVar7 = puVar4[1];
                        *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                        *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                        lVar30 = lVar30 + 0x20;
                      } while (pBVar3 + 0x20 < pBVar10 + uVar33);
                    }
                    goto LAB_001cf115;
                  }
                  goto LAB_001cf7a3;
                }
                seqStore->lit = pBVar10 + uVar33;
              }
              uVar34 = uVar34 + uVar27;
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar33;
              psVar12->offBase = UVar26;
              if (uVar34 < 3) goto LAB_001cf6ab;
              if (0xffff < uVar34 - 3) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->mlBase = (U16)(uVar34 - 3);
              psVar12 = psVar12 + 1;
              seqStore->sequences = psVar12;
              puVar39 = (ulong *)((long)puVar38 + uVar34);
              local_c8 = (uint)uVar37;
              if (puVar39 <= puVar36) {
                if (pBVar6 + (ulong)UVar29 + 2 <= src) goto LAB_001cf746;
                pUVar5[(uint)(*(int *)(pBVar6 + (ulong)UVar29 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)
                      ] = UVar29 + 2;
                pUVar5[(uint)(*(int *)((long)puVar39 + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
                     ((int)puVar39 + -2) - iVar31;
                uVar27 = uVar20;
                if (local_c8 == 0) {
                  local_c8 = 0;
                }
                else {
                  do {
                    uVar20 = uVar37;
                    if ((int)*puVar39 != *(int *)((long)puVar39 - uVar20)) {
                      local_c8 = (uint)uVar20;
                      uVar20 = uVar27;
                      break;
                    }
                    lVar30 = -uVar20;
                    puVar38 = (ulong *)((long)puVar39 + 4);
                    puVar17 = (ulong *)((long)puVar39 + lVar30 + 4);
                    puVar8 = puVar38;
                    if (puVar38 < puVar16) {
                      if (*puVar17 == *puVar38) {
                        lVar25 = 0;
                        do {
                          puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                          if (puVar16 <= puVar8) {
                            puVar17 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                            puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                            goto LAB_001cf33c;
                          }
                          uVar37 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                          uVar34 = *puVar8;
                          lVar25 = lVar25 + 8;
                        } while (uVar37 == uVar34);
                        uVar34 = uVar34 ^ uVar37;
                        uVar37 = 0;
                        if (uVar34 != 0) {
                          for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                          }
                        }
                        uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar25;
                      }
                      else {
                        uVar34 = *puVar38 ^ *puVar17;
                        uVar37 = 0;
                        if (uVar34 != 0) {
                          for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                          }
                        }
                        uVar37 = uVar37 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_001cf33c:
                      if ((puVar8 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar8)
                         ) {
                        puVar8 = (ulong *)((long)puVar8 + 4);
                        puVar17 = (ulong *)((long)puVar17 + 4);
                      }
                      if ((puVar8 < (ulong *)((long)puVar2 - 1U)) &&
                         ((short)*puVar17 == (short)*puVar8)) {
                        puVar8 = (ulong *)((long)puVar8 + 2);
                        puVar17 = (ulong *)((long)puVar17 + 2);
                      }
                      if (puVar8 < puVar2) {
                        puVar8 = (ulong *)((long)puVar8 + (ulong)((char)*puVar17 == (char)*puVar8));
                      }
                      uVar37 = (long)puVar8 - (long)puVar38;
                    }
                    pUVar5[(uint)((int)*puVar39 * -0x61c8864f) >> (bVar13 & 0x1f)] =
                         (int)puVar39 - iVar31;
                    if (seqStore->maxNbSeq <=
                        (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3))
                    goto LAB_001cf6ca;
                    if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
                    puVar38 = (ulong *)seqStore->lit;
                    if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
                    if (puVar2 < puVar39) goto LAB_001cf66d;
                    if (puVar1 < puVar39) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
                    }
                    else {
                      uVar34 = puVar39[1];
                      *puVar38 = *puVar39;
                      puVar38[1] = uVar34;
                    }
                    local_c8 = (uint)uVar27;
                    psVar12 = seqStore->sequences;
                    psVar12->litLength = 0;
                    psVar12->offBase = 1;
                    if (uVar37 + 4 < 3) goto LAB_001cf6ab;
                    if (0xffff < uVar37 + 1) {
                      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                      seqStore->longLengthType = ZSTD_llt_matchLength;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                    }
                    puVar39 = (ulong *)((long)puVar39 + uVar37 + 4);
                    psVar12->mlBase = (U16)(uVar37 + 1);
                    psVar12 = psVar12 + 1;
                    seqStore->sequences = psVar12;
                    uVar37 = uVar27;
                    uVar27 = uVar20;
                  } while (puVar39 <= puVar36);
                }
              }
              puVar8 = (ulong *)((long)puVar39 + 3);
              uVar32 = (uint)uVar20;
              uVar37 = uVar20;
              puVar38 = puVar39;
            } while (puVar8 < puVar36);
          }
          goto LAB_001cf5f5;
        }
        if (puVar8 < puVar36) {
          uVar28 = (ms->cParams).hashLog;
          if (0x20 < uVar28) goto LAB_001cf727;
          bVar13 = 0x40 - (char)uVar28;
          puVar16 = (ulong *)((long)puVar2 - 7);
          puVar1 = puVar2 + -4;
          do {
            puVar17 = puVar38 + 0x10;
            uVar34 = *puVar38 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
            uVar20 = *(ulong *)((long)puVar38 + 1);
            uVar28 = pUVar5[uVar34];
            uVar32 = (uint)uVar37;
            lVar30 = -uVar37;
            uVar27 = 2;
            puVar35 = (ulong *)((long)puVar38 + 2);
            puVar40 = (ulong *)((long)puVar38 + 1);
            while( true ) {
              puVar11 = puVar8;
              uVar20 = uVar20 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
              uVar19 = (int)puVar38 - iVar31;
              iVar21 = *(int *)((long)puVar35 + lVar30);
              pUVar5[uVar34] = uVar19;
              if ((uVar32 != 0) && ((int)*puVar35 == iVar21)) {
                uVar27 = (ulong)(*(char *)((long)puVar35 - 1) ==
                                *(char *)((long)puVar35 + lVar30 + -1));
                puVar38 = (ulong *)((long)puVar35 - uVar27);
                pBVar10 = (BYTE *)((long)puVar35 + (lVar30 - uVar27));
                uVar27 = uVar27 | 4;
                pUVar5[uVar20] = (int)puVar40 - iVar31;
                UVar29 = 1;
                uVar20 = uVar37;
                uVar37 = (ulong)local_c8;
                goto LAB_001cc0e2;
              }
              if ((uVar23 <= uVar28) &&
                 (uVar33 = (ulong)uVar28, puVar8 = puVar40,
                 (int)*puVar38 == *(int *)(pBVar6 + uVar33))) goto LAB_001cc19b;
              uVar28 = pUVar5[uVar20];
              uVar33 = (ulong)uVar28;
              uVar34 = *puVar35 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
              uVar19 = (int)puVar40 - iVar31;
              pUVar5[uVar20] = uVar19;
              if ((uVar23 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar33))) break;
              uVar28 = pUVar5[uVar34];
              puVar40 = (ulong *)((long)puVar35 + uVar27);
              uVar33 = uVar27;
              if (puVar17 <= puVar40) {
                puVar17 = puVar17 + 0x10;
                uVar33 = uVar27 + 1;
              }
              uVar20 = *puVar11;
              puVar8 = (ulong *)(uVar27 + (long)puVar11);
              puVar38 = puVar35;
              uVar27 = uVar33;
              puVar35 = puVar40;
              puVar40 = puVar11;
              if (puVar36 <= puVar8) goto LAB_001cf4ea;
            }
            puVar8 = puVar35;
            uVar20 = uVar34;
            puVar38 = puVar40;
            if (uVar27 < 5) {
LAB_001cc19b:
              pUVar5[uVar20] = (int)puVar8 - iVar31;
            }
            pBVar10 = pBVar6 + uVar33;
            uVar32 = (int)puVar38 - (int)pBVar10;
            uVar20 = (ulong)uVar32;
            if (uVar32 == 0) goto LAB_001cf765;
            UVar29 = uVar32 + 3;
            uVar27 = 4;
            if ((uVar23 < uVar28) && (puVar39 < puVar38)) {
              pBVar3 = pBVar6 + (uVar33 - 1);
              puVar8 = puVar38;
              while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar8 + -1),
                    *(BYTE *)puVar38 == *pBVar10) {
                uVar27 = uVar27 + 1;
                if ((puVar38 <= puVar39) ||
                   (pBVar3 = pBVar10 + -1, puVar8 = puVar38, pBVar10 <= pBVar24)) goto LAB_001cc0e2;
              }
              pBVar10 = pBVar10 + 1;
              puVar38 = puVar8;
            }
LAB_001cc0e2:
            puVar8 = (ulong *)((long)puVar38 + uVar27);
            puVar17 = (ulong *)(pBVar10 + uVar27);
            puVar35 = puVar8;
            if (puVar8 < puVar16) {
              if (*puVar17 == *puVar8) {
                lVar30 = 0;
                do {
                  puVar17 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                  if (puVar16 <= puVar17) {
                    puVar17 = (ulong *)(pBVar10 + lVar30 + uVar27 + 8);
                    puVar35 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
                    goto LAB_001cc24b;
                  }
                  lVar25 = lVar30 + uVar27 + 8;
                  uVar34 = *puVar17;
                  lVar30 = lVar30 + 8;
                } while (*(ulong *)(pBVar10 + lVar25) == uVar34);
                uVar34 = uVar34 ^ *(ulong *)(pBVar10 + lVar25);
                uVar33 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar34 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
              }
              else {
                uVar33 = *puVar8 ^ *puVar17;
                uVar34 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar34 = uVar34 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001cc24b:
              if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar17 = (ulong *)((long)puVar17 + 4);
              }
              if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar35))
              {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar17 = (ulong *)((long)puVar17 + 2);
              }
              if (puVar35 < puVar2) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar17 == (char)*puVar35));
              }
              uVar34 = (long)puVar35 - (long)puVar8;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001cf6ca;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
            uVar33 = (long)puVar38 - (long)puVar39;
            puVar8 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar8 + uVar33))
            goto LAB_001cf64e;
            if (puVar2 < puVar38) goto LAB_001cf66d;
            if (puVar1 < puVar38) {
              ZSTD_safecopyLiterals((BYTE *)puVar8,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar1);
LAB_001cc311:
              seqStore->lit = seqStore->lit + uVar33;
              if (0xffff < uVar33) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
            }
            else {
              uVar9 = puVar39[1];
              *puVar8 = *puVar39;
              puVar8[1] = uVar9;
              pBVar10 = seqStore->lit;
              if (0x10 < uVar33) {
                if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) <
                    0xffffffffffffffe1) {
                  uVar9 = puVar39[3];
                  *(ulong *)(pBVar10 + 0x10) = puVar39[2];
                  *(ulong *)(pBVar10 + 0x18) = uVar9;
                  if (0x20 < (long)uVar33) {
                    lVar30 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                      uVar7 = puVar4[1];
                      pBVar3 = pBVar10 + lVar30 + 0x20;
                      *(undefined8 *)pBVar3 = *puVar4;
                      *(undefined8 *)(pBVar3 + 8) = uVar7;
                      puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                      uVar7 = puVar4[1];
                      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                      *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                      lVar30 = lVar30 + 0x20;
                    } while (pBVar3 + 0x20 < pBVar10 + uVar33);
                  }
                  goto LAB_001cc311;
                }
                goto LAB_001cf7a3;
              }
              seqStore->lit = pBVar10 + uVar33;
            }
            uVar34 = uVar34 + uVar27;
            psVar12 = seqStore->sequences;
            psVar12->litLength = (U16)uVar33;
            psVar12->offBase = UVar29;
            if (uVar34 < 3) goto LAB_001cf6ab;
            if (0xffff < uVar34 - 3) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->mlBase = (U16)(uVar34 - 3);
            psVar12 = psVar12 + 1;
            seqStore->sequences = psVar12;
            puVar39 = (ulong *)((long)puVar38 + uVar34);
            local_c8 = (uint)uVar37;
            if (puVar39 <= puVar36) {
              if (pBVar6 + (ulong)uVar19 + 2 <= src) goto LAB_001cf746;
              pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar19 + 2) * -0x30e44323405a9d00) >>
                     (bVar13 & 0x3f)] = uVar19 + 2;
              pUVar5[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)
                    ] = ((int)puVar39 + -2) - iVar31;
              uVar27 = uVar20;
              if (local_c8 == 0) {
                local_c8 = 0;
              }
              else {
                do {
                  uVar20 = uVar37;
                  if ((int)*puVar39 != *(int *)((long)puVar39 - uVar20)) {
                    local_c8 = (uint)uVar20;
                    uVar20 = uVar27;
                    break;
                  }
                  lVar30 = -uVar20;
                  puVar38 = (ulong *)((long)puVar39 + 4);
                  puVar17 = (ulong *)((long)puVar39 + lVar30 + 4);
                  puVar8 = puVar38;
                  if (puVar38 < puVar16) {
                    if (*puVar17 == *puVar38) {
                      lVar25 = 0;
                      do {
                        puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                        if (puVar16 <= puVar8) {
                          puVar17 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                          puVar8 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                          goto LAB_001cc528;
                        }
                        uVar37 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                        uVar34 = *puVar8;
                        lVar25 = lVar25 + 8;
                      } while (uVar37 == uVar34);
                      uVar34 = uVar34 ^ uVar37;
                      uVar37 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar25;
                    }
                    else {
                      uVar34 = *puVar38 ^ *puVar17;
                      uVar37 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      uVar37 = uVar37 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_001cc528:
                    if ((puVar8 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar8))
                    {
                      puVar8 = (ulong *)((long)puVar8 + 4);
                      puVar17 = (ulong *)((long)puVar17 + 4);
                    }
                    if ((puVar8 < (ulong *)((long)puVar2 - 1U)) &&
                       ((short)*puVar17 == (short)*puVar8)) {
                      puVar8 = (ulong *)((long)puVar8 + 2);
                      puVar17 = (ulong *)((long)puVar17 + 2);
                    }
                    if (puVar8 < puVar2) {
                      puVar8 = (ulong *)((long)puVar8 + (ulong)((char)*puVar17 == (char)*puVar8));
                    }
                    uVar37 = (long)puVar8 - (long)puVar38;
                  }
                  pUVar5[*puVar39 * -0x30e44323405a9d00 >> (bVar13 & 0x3f)] = (int)puVar39 - iVar31;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3))
                  goto LAB_001cf6ca;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
                  puVar38 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
                  if (puVar2 < puVar39) goto LAB_001cf66d;
                  if (puVar1 < puVar39) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar1);
                  }
                  else {
                    uVar34 = puVar39[1];
                    *puVar38 = *puVar39;
                    puVar38[1] = uVar34;
                  }
                  local_c8 = (uint)uVar27;
                  psVar12 = seqStore->sequences;
                  psVar12->litLength = 0;
                  psVar12->offBase = 1;
                  if (uVar37 + 4 < 3) goto LAB_001cf6ab;
                  if (0xffff < uVar37 + 1) {
                    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                    seqStore->longLengthType = ZSTD_llt_matchLength;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                  }
                  puVar39 = (ulong *)((long)puVar39 + uVar37 + 4);
                  psVar12->mlBase = (U16)(uVar37 + 1);
                  psVar12 = psVar12 + 1;
                  seqStore->sequences = psVar12;
                  uVar37 = uVar27;
                  uVar27 = uVar20;
                } while (puVar39 <= puVar36);
              }
            }
            puVar8 = (ulong *)((long)puVar39 + 3);
            uVar32 = (uint)uVar20;
            uVar37 = uVar20;
            puVar38 = puVar39;
          } while (puVar8 < puVar36);
        }
      }
LAB_001cf4ea:
      if (uVar22 <= uVar14) {
        uVar22 = 0;
      }
      uVar28 = uVar22;
      if (uVar32 != 0) {
        uVar28 = uVar15;
      }
      if (uVar15 <= uVar14) {
        uVar28 = uVar22;
        uVar15 = 0;
      }
      if (uVar32 != 0) {
        uVar15 = uVar32;
      }
    }
    *rep = uVar15;
    if (local_c8 != 0) {
      uVar28 = local_c8;
    }
    goto LAB_001cf62f;
  }
  pBVar6 = (ms->window).base;
  puVar2 = (ulong *)(srcSize + (long)src);
  iVar31 = (int)pBVar6;
  iVar21 = (int)puVar2 - iVar31;
  uVar23 = (ms->window).dictLimit;
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar15 = iVar21 - uVar14;
  if (iVar21 - uVar23 <= uVar14) {
    uVar15 = uVar23;
  }
  if (ms->loadedDictEnd != 0) {
    uVar15 = uVar23;
  }
  pBVar24 = pBVar6 + uVar15;
  puVar38 = (ulong *)((ulong)(pBVar24 == (BYTE *)src) + (long)src);
  iVar21 = (int)puVar38 - iVar31;
  uVar22 = iVar21 - uVar14;
  if (iVar21 - uVar23 <= uVar14) {
    uVar22 = uVar23;
  }
  if (ms->loadedDictEnd != 0) {
    uVar22 = uVar23;
  }
  uVar37 = (ulong)(uVar32 + 1);
  puVar8 = (ulong *)((long)src + (srcSize - 8));
  uVar32 = *rep;
  uVar23 = rep[1];
  uVar22 = iVar21 - uVar22;
  local_90 = uVar23;
  if (uVar22 < uVar23) {
    local_90 = 0;
  }
  local_d8 = (ulong)local_90;
  uVar14 = 0;
  if (uVar32 <= uVar22) {
    uVar14 = uVar32;
  }
  uVar20 = (ulong)uVar14;
  puVar36 = (ulong *)((long)puVar38 + uVar37);
  puVar16 = (ulong *)((long)puVar38 + uVar37 + 1);
  if (uVar28 == 5) {
    if (puVar16 < puVar8) {
      uVar28 = (ms->cParams).hashLog;
      if (0x20 < uVar28) goto LAB_001cf727;
      bVar13 = 0x40 - (char)uVar28;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar17 = puVar2 + -4;
      do {
        local_90 = (uint)local_d8;
        puVar35 = puVar38 + 0x10;
        uVar33 = *puVar38 * -0x30e4432345000000 >> (bVar13 & 0x3f);
        uVar27 = *(ulong *)((long)puVar38 + 1);
        uVar28 = pUVar5[uVar33];
        uVar14 = (uint)uVar20;
        lVar30 = -uVar20;
        uVar34 = uVar37;
        puVar40 = (ulong *)((long)puVar38 + 1);
        while( true ) {
          puVar18 = puVar16;
          puVar11 = puVar36;
          uVar27 = uVar27 * -0x30e4432345000000 >> (bVar13 & 0x3f);
          uVar19 = (int)puVar38 - iVar31;
          iVar21 = *(int *)((long)puVar11 + lVar30);
          pUVar5[uVar33] = uVar19;
          if ((uVar14 != 0) && ((int)*puVar11 == iVar21)) {
            uVar34 = (ulong)(*(char *)((long)puVar11 - 1) == *(char *)((long)puVar11 + lVar30 + -1))
            ;
            puVar38 = (ulong *)((long)puVar11 - uVar34);
            pBVar10 = (BYTE *)((long)puVar11 + (lVar30 - uVar34));
            uVar34 = uVar34 | 4;
            pUVar5[uVar27] = (int)puVar40 - iVar31;
            UVar29 = 1;
            uVar27 = uVar20;
            goto LAB_001cd7e0;
          }
          if ((uVar15 <= uVar28) &&
             (uVar9 = (ulong)uVar28, puVar36 = puVar40, (int)*puVar38 == *(int *)(pBVar6 + uVar9)))
          goto LAB_001cd88d;
          uVar28 = pUVar5[uVar27];
          uVar9 = (ulong)uVar28;
          uVar33 = *puVar11 * -0x30e4432345000000 >> (bVar13 & 0x3f);
          uVar19 = (int)puVar40 - iVar31;
          pUVar5[uVar27] = uVar19;
          if ((uVar15 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar9))) break;
          uVar28 = pUVar5[uVar33];
          uVar9 = uVar34;
          if (puVar35 <= (ulong *)((long)puVar11 + uVar34)) {
            puVar35 = puVar35 + 0x10;
            uVar9 = uVar34 + 1;
          }
          uVar27 = *puVar18;
          puVar16 = (ulong *)(uVar34 + (long)puVar18);
          puVar36 = (ulong *)((long)puVar11 + uVar34);
          puVar38 = puVar11;
          uVar34 = uVar9;
          puVar40 = puVar18;
          if (puVar8 <= puVar16) goto LAB_001cf52a;
        }
        puVar36 = puVar11;
        uVar27 = uVar33;
        puVar38 = puVar40;
        if (uVar34 < 5) {
LAB_001cd88d:
          pUVar5[uVar27] = (int)puVar36 - iVar31;
        }
        pBVar10 = pBVar6 + uVar9;
        uVar14 = (int)puVar38 - (int)pBVar10;
        uVar27 = (ulong)uVar14;
        if (uVar14 == 0) goto LAB_001cf765;
        UVar29 = uVar14 + 3;
        uVar34 = 4;
        local_d8 = uVar20;
        if ((uVar15 < uVar28) && (puVar39 < puVar38)) {
          pBVar3 = pBVar6 + (uVar9 - 1);
          puVar36 = puVar38;
          while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar36 + -1),
                *(BYTE *)puVar38 == *pBVar10) {
            uVar34 = uVar34 + 1;
            if ((puVar38 <= puVar39) ||
               (pBVar3 = pBVar10 + -1, puVar36 = puVar38, pBVar10 <= pBVar24)) goto LAB_001cd7e0;
          }
          pBVar10 = pBVar10 + 1;
          puVar38 = puVar36;
        }
LAB_001cd7e0:
        uVar20 = uVar27;
        puVar36 = (ulong *)((long)puVar38 + uVar34);
        puVar16 = (ulong *)(pBVar10 + uVar34);
        puVar35 = puVar36;
        if (puVar36 < puVar1) {
          if (*puVar16 == *puVar36) {
            lVar30 = 0;
            do {
              puVar16 = (ulong *)((long)puVar38 + lVar30 + uVar34 + 8);
              if (puVar1 <= puVar16) {
                puVar16 = (ulong *)(pBVar10 + lVar30 + uVar34 + 8);
                puVar35 = (ulong *)((long)puVar38 + lVar30 + 8 + uVar34);
                goto LAB_001cd93f;
              }
              lVar25 = lVar30 + uVar34 + 8;
              uVar27 = *puVar16;
              lVar30 = lVar30 + 8;
            } while (*(ulong *)(pBVar10 + lVar25) == uVar27);
            uVar27 = uVar27 ^ *(ulong *)(pBVar10 + lVar25);
            uVar33 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar27 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
          }
          else {
            uVar33 = *puVar36 ^ *puVar16;
            uVar27 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            uVar27 = uVar27 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001cd93f:
          if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar16 == (short)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar35 < puVar2) {
            puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar16 == (char)*puVar35));
          }
          uVar27 = (long)puVar35 - (long)puVar36;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001cf6ca;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
        uVar33 = (long)puVar38 - (long)puVar39;
        puVar36 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar36 + uVar33))
        goto LAB_001cf64e;
        if (puVar2 < puVar38) goto LAB_001cf66d;
        if (puVar17 < puVar38) {
          ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar17);
LAB_001cda05:
          seqStore->lit = seqStore->lit + uVar33;
          if (0xffff < uVar33) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar9 = puVar39[1];
          *puVar36 = *puVar39;
          puVar36[1] = uVar9;
          pBVar10 = seqStore->lit;
          if (0x10 < uVar33) {
            if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) < 0xffffffffffffffe1
               ) {
              uVar9 = puVar39[3];
              *(ulong *)(pBVar10 + 0x10) = puVar39[2];
              *(ulong *)(pBVar10 + 0x18) = uVar9;
              if (0x20 < (long)uVar33) {
                lVar30 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                  uVar7 = puVar4[1];
                  pBVar3 = pBVar10 + lVar30 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar7;
                  puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                  uVar7 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                  lVar30 = lVar30 + 0x20;
                } while (pBVar3 + 0x20 < pBVar10 + uVar33);
              }
              goto LAB_001cda05;
            }
            goto LAB_001cf7a3;
          }
          seqStore->lit = pBVar10 + uVar33;
        }
        uVar27 = uVar27 + uVar34;
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar33;
        psVar12->offBase = UVar29;
        if (uVar27 < 3) goto LAB_001cf6ab;
        if (0xffff < uVar27 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->mlBase = (U16)(uVar27 - 3);
        psVar12 = psVar12 + 1;
        seqStore->sequences = psVar12;
        puVar39 = (ulong *)((long)puVar38 + uVar27);
        if (puVar39 <= puVar8) {
          if (pBVar6 + (ulong)uVar19 + 2 <= src) goto LAB_001cf746;
          pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar19 + 2) * -0x30e4432345000000) >>
                 (bVar13 & 0x3f)] = uVar19 + 2;
          pUVar5[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
               ((int)puVar39 + -2) - iVar31;
          uVar28 = (uint)local_d8;
          if ((uint)local_d8 == 0) {
            local_d8 = 0;
          }
          else {
            do {
              uVar27 = uVar20;
              local_d8 = (ulong)uVar28;
              uVar20 = uVar27;
              if ((int)*puVar39 != *(int *)((long)puVar39 - (ulong)uVar28)) break;
              lVar30 = -(ulong)uVar28;
              puVar38 = (ulong *)((long)puVar39 + 4);
              puVar16 = (ulong *)((long)puVar39 + lVar30 + 4);
              puVar36 = puVar38;
              if (puVar38 < puVar1) {
                if (*puVar16 == *puVar38) {
                  lVar25 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                    if (puVar1 <= puVar36) {
                      puVar16 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                      puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                      goto LAB_001cdc23;
                    }
                    uVar20 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                    uVar34 = *puVar36;
                    lVar25 = lVar25 + 8;
                  } while (uVar20 == uVar34);
                  uVar34 = uVar34 ^ uVar20;
                  uVar20 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar25;
                }
                else {
                  uVar34 = *puVar38 ^ *puVar16;
                  uVar20 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = uVar20 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001cdc23:
                if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar16 = (ulong *)((long)puVar16 + 4);
                }
                if ((puVar36 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar16 == (short)*puVar36)
                   ) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar16 = (ulong *)((long)puVar16 + 2);
                }
                if (puVar36 < puVar2) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar16 == (char)*puVar36));
                }
                uVar20 = (long)puVar36 - (long)puVar38;
              }
              pUVar5[*puVar39 * -0x30e4432345000000 >> (bVar13 & 0x3f)] = (int)puVar39 - iVar31;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001cf6ca;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
              puVar38 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
              if (puVar2 < puVar39) goto LAB_001cf66d;
              if (puVar17 < puVar39) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar17);
              }
              else {
                uVar34 = puVar39[1];
                *puVar38 = *puVar39;
                puVar38[1] = uVar34;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = 0;
              psVar12->offBase = 1;
              if (uVar20 + 4 < 3) goto LAB_001cf6ab;
              if (0xffff < uVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar39 = (ulong *)((long)puVar39 + uVar20 + 4);
              psVar12->mlBase = (U16)(uVar20 + 1);
              psVar12 = psVar12 + 1;
              seqStore->sequences = psVar12;
              uVar20 = local_d8;
              local_d8 = uVar27;
              uVar28 = (uint)uVar27;
            } while (puVar39 <= puVar8);
          }
        }
        local_90 = (uint)local_d8;
        puVar36 = (ulong *)((long)puVar39 + uVar37);
        puVar16 = (ulong *)((long)puVar39 + uVar37 + 1);
        uVar14 = (uint)uVar20;
        puVar38 = puVar39;
      } while (puVar16 < puVar8);
    }
LAB_001cf52a:
    if (uVar23 <= uVar22) {
      uVar23 = 0;
    }
    uVar28 = uVar23;
    if (uVar14 != 0) {
      uVar28 = uVar32;
    }
    if (uVar32 <= uVar22) {
      uVar28 = uVar23;
      uVar32 = 0;
    }
    if (uVar14 != 0) {
      uVar32 = uVar14;
    }
  }
  else {
    if (uVar28 == 6) {
      if (puVar16 < puVar8) {
        uVar28 = (ms->cParams).hashLog;
        if (0x20 < uVar28) goto LAB_001cf727;
        bVar13 = 0x40 - (char)uVar28;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar17 = puVar2 + -4;
        do {
          local_90 = (uint)local_d8;
          puVar35 = puVar38 + 0x10;
          uVar33 = *puVar38 * -0x30e4432340650000 >> (bVar13 & 0x3f);
          uVar27 = *(ulong *)((long)puVar38 + 1);
          uVar28 = pUVar5[uVar33];
          uVar14 = (uint)uVar20;
          lVar30 = -uVar20;
          uVar34 = uVar37;
          puVar40 = (ulong *)((long)puVar38 + 1);
          while( true ) {
            puVar18 = puVar16;
            puVar11 = puVar36;
            uVar27 = uVar27 * -0x30e4432340650000 >> (bVar13 & 0x3f);
            uVar19 = (int)puVar38 - iVar31;
            iVar21 = *(int *)((long)puVar11 + lVar30);
            pUVar5[uVar33] = uVar19;
            if ((uVar14 != 0) && ((int)*puVar11 == iVar21)) {
              uVar34 = (ulong)(*(char *)((long)puVar11 - 1) ==
                              *(char *)((long)puVar11 + lVar30 + -1));
              puVar38 = (ulong *)((long)puVar11 - uVar34);
              pBVar10 = (BYTE *)((long)puVar11 + (lVar30 - uVar34));
              uVar34 = uVar34 | 4;
              pUVar5[uVar27] = (int)puVar40 - iVar31;
              UVar29 = 1;
              uVar27 = uVar20;
              goto LAB_001cc889;
            }
            if ((uVar15 <= uVar28) &&
               (uVar9 = (ulong)uVar28, puVar36 = puVar40, (int)*puVar38 == *(int *)(pBVar6 + uVar9))
               ) goto LAB_001cc936;
            uVar28 = pUVar5[uVar27];
            uVar9 = (ulong)uVar28;
            uVar33 = *puVar11 * -0x30e4432340650000 >> (bVar13 & 0x3f);
            uVar19 = (int)puVar40 - iVar31;
            pUVar5[uVar27] = uVar19;
            if ((uVar15 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar9))) break;
            uVar28 = pUVar5[uVar33];
            uVar9 = uVar34;
            if (puVar35 <= (ulong *)((long)puVar11 + uVar34)) {
              puVar35 = puVar35 + 0x10;
              uVar9 = uVar34 + 1;
            }
            uVar27 = *puVar18;
            puVar16 = (ulong *)(uVar34 + (long)puVar18);
            puVar36 = (ulong *)((long)puVar11 + uVar34);
            puVar38 = puVar11;
            uVar34 = uVar9;
            puVar40 = puVar18;
            if (puVar8 <= puVar16) goto LAB_001cf52a;
          }
          puVar36 = puVar11;
          uVar27 = uVar33;
          puVar38 = puVar40;
          if (uVar34 < 5) {
LAB_001cc936:
            pUVar5[uVar27] = (int)puVar36 - iVar31;
          }
          pBVar10 = pBVar6 + uVar9;
          uVar14 = (int)puVar38 - (int)pBVar10;
          uVar27 = (ulong)uVar14;
          if (uVar14 == 0) goto LAB_001cf765;
          UVar29 = uVar14 + 3;
          uVar34 = 4;
          local_d8 = uVar20;
          if ((uVar15 < uVar28) && (puVar39 < puVar38)) {
            pBVar3 = pBVar6 + (uVar9 - 1);
            puVar36 = puVar38;
            while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar36 + -1),
                  *(BYTE *)puVar38 == *pBVar10) {
              uVar34 = uVar34 + 1;
              if ((puVar38 <= puVar39) ||
                 (pBVar3 = pBVar10 + -1, puVar36 = puVar38, pBVar10 <= pBVar24)) goto LAB_001cc889;
            }
            pBVar10 = pBVar10 + 1;
            puVar38 = puVar36;
          }
LAB_001cc889:
          uVar20 = uVar27;
          puVar36 = (ulong *)((long)puVar38 + uVar34);
          puVar16 = (ulong *)(pBVar10 + uVar34);
          puVar35 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar16 == *puVar36) {
              lVar30 = 0;
              do {
                puVar16 = (ulong *)((long)puVar38 + lVar30 + uVar34 + 8);
                if (puVar1 <= puVar16) {
                  puVar16 = (ulong *)(pBVar10 + lVar30 + uVar34 + 8);
                  puVar35 = (ulong *)((long)puVar38 + lVar30 + 8 + uVar34);
                  goto LAB_001cc9e8;
                }
                lVar25 = lVar30 + uVar34 + 8;
                uVar27 = *puVar16;
                lVar30 = lVar30 + 8;
              } while (*(ulong *)(pBVar10 + lVar25) == uVar27);
              uVar27 = uVar27 ^ *(ulong *)(pBVar10 + lVar25);
              uVar33 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar27 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
            }
            else {
              uVar33 = *puVar36 ^ *puVar16;
              uVar27 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001cc9e8:
            if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar16 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar35 < puVar2) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar16 == (char)*puVar35));
            }
            uVar27 = (long)puVar35 - (long)puVar36;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001cf6ca;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
          uVar33 = (long)puVar38 - (long)puVar39;
          puVar36 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar36 + uVar33))
          goto LAB_001cf64e;
          if (puVar2 < puVar38) goto LAB_001cf66d;
          if (puVar17 < puVar38) {
            ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar17);
LAB_001ccab4:
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar9 = puVar39[1];
            *puVar36 = *puVar39;
            puVar36[1] = uVar9;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar33) {
              if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) <
                  0xffffffffffffffe1) {
                uVar9 = puVar39[3];
                *(ulong *)(pBVar10 + 0x10) = puVar39[2];
                *(ulong *)(pBVar10 + 0x18) = uVar9;
                if (0x20 < (long)uVar33) {
                  lVar30 = 0;
                  do {
                    puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                    uVar7 = puVar4[1];
                    pBVar3 = pBVar10 + lVar30 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar4;
                    *(undefined8 *)(pBVar3 + 8) = uVar7;
                    puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                    uVar7 = puVar4[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                    lVar30 = lVar30 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar10 + uVar33);
                }
                goto LAB_001ccab4;
              }
              goto LAB_001cf7a3;
            }
            seqStore->lit = pBVar10 + uVar33;
          }
          uVar27 = uVar27 + uVar34;
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar33;
          psVar12->offBase = UVar29;
          if (uVar27 < 3) goto LAB_001cf6ab;
          if (0xffff < uVar27 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->mlBase = (U16)(uVar27 - 3);
          psVar12 = psVar12 + 1;
          seqStore->sequences = psVar12;
          puVar39 = (ulong *)((long)puVar38 + uVar27);
          if (puVar39 <= puVar8) {
            if (pBVar6 + (ulong)uVar19 + 2 <= src) goto LAB_001cf746;
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar19 + 2) * -0x30e4432340650000) >>
                   (bVar13 & 0x3f)] = uVar19 + 2;
            pUVar5[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e4432340650000) >> (bVar13 & 0x3f)]
                 = ((int)puVar39 + -2) - iVar31;
            uVar28 = (uint)local_d8;
            if ((uint)local_d8 == 0) {
              local_d8 = 0;
            }
            else {
              do {
                uVar27 = uVar20;
                local_d8 = (ulong)uVar28;
                uVar20 = uVar27;
                if ((int)*puVar39 != *(int *)((long)puVar39 - (ulong)uVar28)) break;
                lVar30 = -(ulong)uVar28;
                puVar38 = (ulong *)((long)puVar39 + 4);
                puVar16 = (ulong *)((long)puVar39 + lVar30 + 4);
                puVar36 = puVar38;
                if (puVar38 < puVar1) {
                  if (*puVar16 == *puVar38) {
                    lVar25 = 0;
                    do {
                      puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                      if (puVar1 <= puVar36) {
                        puVar16 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                        puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                        goto LAB_001ccccd;
                      }
                      uVar20 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                      uVar34 = *puVar36;
                      lVar25 = lVar25 + 8;
                    } while (uVar20 == uVar34);
                    uVar34 = uVar34 ^ uVar20;
                    uVar20 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar34 = *puVar38 ^ *puVar16;
                    uVar20 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = uVar20 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001ccccd:
                  if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar36))
                  {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar16 = (ulong *)((long)puVar16 + 4);
                  }
                  if ((puVar36 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar16 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar16 = (ulong *)((long)puVar16 + 2);
                  }
                  if (puVar36 < puVar2) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar16 == (char)*puVar36));
                  }
                  uVar20 = (long)puVar36 - (long)puVar38;
                }
                pUVar5[*puVar39 * -0x30e4432340650000 >> (bVar13 & 0x3f)] = (int)puVar39 - iVar31;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3)) goto LAB_001cf6ca;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
                puVar38 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
                if (puVar2 < puVar39) goto LAB_001cf66d;
                if (puVar17 < puVar39) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar17);
                }
                else {
                  uVar34 = puVar39[1];
                  *puVar38 = *puVar39;
                  puVar38[1] = uVar34;
                }
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offBase = 1;
                if (uVar20 + 4 < 3) goto LAB_001cf6ab;
                if (0xffff < uVar20 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar39 = (ulong *)((long)puVar39 + uVar20 + 4);
                psVar12->mlBase = (U16)(uVar20 + 1);
                psVar12 = psVar12 + 1;
                seqStore->sequences = psVar12;
                uVar20 = local_d8;
                local_d8 = uVar27;
                uVar28 = (uint)uVar27;
              } while (puVar39 <= puVar8);
            }
          }
          local_90 = (uint)local_d8;
          puVar36 = (ulong *)((long)puVar39 + uVar37);
          puVar16 = (ulong *)((long)puVar39 + uVar37 + 1);
          uVar14 = (uint)uVar20;
          puVar38 = puVar39;
        } while (puVar16 < puVar8);
      }
      goto LAB_001cf52a;
    }
    if (uVar28 == 7) {
      if (puVar16 < puVar8) {
        uVar28 = (ms->cParams).hashLog;
        if (0x20 < uVar28) goto LAB_001cf727;
        bVar13 = 0x40 - (char)uVar28;
        puVar1 = (ulong *)((long)puVar2 - 7);
        puVar17 = puVar2 + -4;
        do {
          local_90 = (uint)local_d8;
          puVar35 = puVar38 + 0x10;
          uVar33 = *puVar38 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
          uVar27 = *(ulong *)((long)puVar38 + 1);
          uVar28 = pUVar5[uVar33];
          uVar14 = (uint)uVar20;
          lVar30 = -uVar20;
          uVar34 = uVar37;
          puVar40 = (ulong *)((long)puVar38 + 1);
          while( true ) {
            puVar18 = puVar16;
            puVar11 = puVar36;
            uVar27 = uVar27 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
            uVar19 = (int)puVar38 - iVar31;
            iVar21 = *(int *)((long)puVar11 + lVar30);
            pUVar5[uVar33] = uVar19;
            if ((uVar14 != 0) && ((int)*puVar11 == iVar21)) {
              uVar34 = (ulong)(*(char *)((long)puVar11 - 1) ==
                              *(char *)((long)puVar11 + lVar30 + -1));
              puVar38 = (ulong *)((long)puVar11 - uVar34);
              pBVar10 = (BYTE *)((long)puVar11 + (lVar30 - uVar34));
              uVar34 = uVar34 | 4;
              pUVar5[uVar27] = (int)puVar40 - iVar31;
              UVar29 = 1;
              uVar27 = uVar20;
              goto LAB_001cb849;
            }
            if ((uVar15 <= uVar28) &&
               (uVar9 = (ulong)uVar28, puVar36 = puVar40, (int)*puVar38 == *(int *)(pBVar6 + uVar9))
               ) goto LAB_001cb8f6;
            uVar28 = pUVar5[uVar27];
            uVar9 = (ulong)uVar28;
            uVar33 = *puVar11 * -0x30e44323405a9d00 >> (bVar13 & 0x3f);
            uVar19 = (int)puVar40 - iVar31;
            pUVar5[uVar27] = uVar19;
            if ((uVar15 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar9))) break;
            uVar28 = pUVar5[uVar33];
            uVar9 = uVar34;
            if (puVar35 <= (ulong *)((long)puVar11 + uVar34)) {
              puVar35 = puVar35 + 0x10;
              uVar9 = uVar34 + 1;
            }
            uVar27 = *puVar18;
            puVar16 = (ulong *)(uVar34 + (long)puVar18);
            puVar36 = (ulong *)((long)puVar11 + uVar34);
            puVar38 = puVar11;
            uVar34 = uVar9;
            puVar40 = puVar18;
            if (puVar8 <= puVar16) goto LAB_001cf52a;
          }
          puVar36 = puVar11;
          uVar27 = uVar33;
          puVar38 = puVar40;
          if (uVar34 < 5) {
LAB_001cb8f6:
            pUVar5[uVar27] = (int)puVar36 - iVar31;
          }
          pBVar10 = pBVar6 + uVar9;
          uVar14 = (int)puVar38 - (int)pBVar10;
          uVar27 = (ulong)uVar14;
          if (uVar14 == 0) goto LAB_001cf765;
          UVar29 = uVar14 + 3;
          uVar34 = 4;
          local_d8 = uVar20;
          if ((uVar15 < uVar28) && (puVar39 < puVar38)) {
            pBVar3 = pBVar6 + (uVar9 - 1);
            puVar36 = puVar38;
            while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar36 + -1),
                  *(BYTE *)puVar38 == *pBVar10) {
              uVar34 = uVar34 + 1;
              if ((puVar38 <= puVar39) ||
                 (pBVar3 = pBVar10 + -1, puVar36 = puVar38, pBVar10 <= pBVar24)) goto LAB_001cb849;
            }
            pBVar10 = pBVar10 + 1;
            puVar38 = puVar36;
          }
LAB_001cb849:
          uVar20 = uVar27;
          puVar36 = (ulong *)((long)puVar38 + uVar34);
          puVar16 = (ulong *)(pBVar10 + uVar34);
          puVar35 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar16 == *puVar36) {
              lVar30 = 0;
              do {
                puVar16 = (ulong *)((long)puVar38 + lVar30 + uVar34 + 8);
                if (puVar1 <= puVar16) {
                  puVar16 = (ulong *)(pBVar10 + lVar30 + uVar34 + 8);
                  puVar35 = (ulong *)((long)puVar38 + lVar30 + 8 + uVar34);
                  goto LAB_001cb9a8;
                }
                lVar25 = lVar30 + uVar34 + 8;
                uVar27 = *puVar16;
                lVar30 = lVar30 + 8;
              } while (*(ulong *)(pBVar10 + lVar25) == uVar27);
              uVar27 = uVar27 ^ *(ulong *)(pBVar10 + lVar25);
              uVar33 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar27 = (uVar33 >> 3 & 0x1fffffff) + lVar30;
            }
            else {
              uVar33 = *puVar36 ^ *puVar16;
              uVar27 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001cb9a8:
            if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar16 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar35 < puVar2) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar16 == (char)*puVar35));
            }
            uVar27 = (long)puVar35 - (long)puVar36;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001cf6ca;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
          uVar33 = (long)puVar38 - (long)puVar39;
          puVar36 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar36 + uVar33))
          goto LAB_001cf64e;
          if (puVar2 < puVar38) goto LAB_001cf66d;
          if (puVar17 < puVar38) {
            ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar17);
LAB_001cba74:
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf784;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar9 = puVar39[1];
            *puVar36 = *puVar39;
            puVar36[1] = uVar9;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar33) {
              if ((ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2))) <
                  0xffffffffffffffe1) {
                uVar9 = puVar39[3];
                *(ulong *)(pBVar10 + 0x10) = puVar39[2];
                *(ulong *)(pBVar10 + 0x18) = uVar9;
                if (0x20 < (long)uVar33) {
                  lVar30 = 0;
                  do {
                    puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                    uVar7 = puVar4[1];
                    pBVar3 = pBVar10 + lVar30 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar4;
                    *(undefined8 *)(pBVar3 + 8) = uVar7;
                    puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                    uVar7 = puVar4[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                    lVar30 = lVar30 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar10 + uVar33);
                }
                goto LAB_001cba74;
              }
              goto LAB_001cf7a3;
            }
            seqStore->lit = pBVar10 + uVar33;
          }
          uVar27 = uVar27 + uVar34;
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar33;
          psVar12->offBase = UVar29;
          if (uVar27 < 3) goto LAB_001cf6ab;
          if (0xffff < uVar27 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->mlBase = (U16)(uVar27 - 3);
          psVar12 = psVar12 + 1;
          seqStore->sequences = psVar12;
          puVar39 = (ulong *)((long)puVar38 + uVar27);
          if (puVar39 <= puVar8) {
            if (pBVar6 + (ulong)uVar19 + 2 <= src) goto LAB_001cf746;
            pUVar5[(ulong)(*(long *)(pBVar6 + (ulong)uVar19 + 2) * -0x30e44323405a9d00) >>
                   (bVar13 & 0x3f)] = uVar19 + 2;
            pUVar5[(ulong)(*(long *)((long)puVar39 + -2) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)]
                 = ((int)puVar39 + -2) - iVar31;
            uVar28 = (uint)local_d8;
            if ((uint)local_d8 == 0) {
              local_d8 = 0;
            }
            else {
              do {
                uVar27 = uVar20;
                local_d8 = (ulong)uVar28;
                uVar20 = uVar27;
                if ((int)*puVar39 != *(int *)((long)puVar39 - (ulong)uVar28)) break;
                lVar30 = -(ulong)uVar28;
                puVar38 = (ulong *)((long)puVar39 + 4);
                puVar16 = (ulong *)((long)puVar39 + lVar30 + 4);
                puVar36 = puVar38;
                if (puVar38 < puVar1) {
                  if (*puVar16 == *puVar38) {
                    lVar25 = 0;
                    do {
                      puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                      if (puVar1 <= puVar36) {
                        puVar16 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                        puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                        goto LAB_001cbc8d;
                      }
                      uVar20 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                      uVar34 = *puVar36;
                      lVar25 = lVar25 + 8;
                    } while (uVar20 == uVar34);
                    uVar34 = uVar34 ^ uVar20;
                    uVar20 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar25;
                  }
                  else {
                    uVar34 = *puVar38 ^ *puVar16;
                    uVar20 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = uVar20 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001cbc8d:
                  if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar36))
                  {
                    puVar36 = (ulong *)((long)puVar36 + 4);
                    puVar16 = (ulong *)((long)puVar16 + 4);
                  }
                  if ((puVar36 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar16 == (short)*puVar36)) {
                    puVar36 = (ulong *)((long)puVar36 + 2);
                    puVar16 = (ulong *)((long)puVar16 + 2);
                  }
                  if (puVar36 < puVar2) {
                    puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar16 == (char)*puVar36));
                  }
                  uVar20 = (long)puVar36 - (long)puVar38;
                }
                pUVar5[*puVar39 * -0x30e44323405a9d00 >> (bVar13 & 0x3f)] = (int)puVar39 - iVar31;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3)) goto LAB_001cf6ca;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
                puVar38 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
                if (puVar2 < puVar39) goto LAB_001cf66d;
                if (puVar17 < puVar39) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar17);
                }
                else {
                  uVar34 = puVar39[1];
                  *puVar38 = *puVar39;
                  puVar38[1] = uVar34;
                }
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offBase = 1;
                if (uVar20 + 4 < 3) goto LAB_001cf6ab;
                if (0xffff < uVar20 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar39 = (ulong *)((long)puVar39 + uVar20 + 4);
                psVar12->mlBase = (U16)(uVar20 + 1);
                psVar12 = psVar12 + 1;
                seqStore->sequences = psVar12;
                uVar20 = local_d8;
                local_d8 = uVar27;
                uVar28 = (uint)uVar27;
              } while (puVar39 <= puVar8);
            }
          }
          local_90 = (uint)local_d8;
          puVar36 = (ulong *)((long)puVar39 + uVar37);
          puVar16 = (ulong *)((long)puVar39 + uVar37 + 1);
          uVar14 = (uint)uVar20;
          puVar38 = puVar39;
        } while (puVar16 < puVar8);
      }
      goto LAB_001cf52a;
    }
    if (puVar16 < puVar8) {
      uVar28 = (ms->cParams).hashLog;
      iVar21 = uVar28 - 0x20;
      if (0x1f < uVar28 && iVar21 != 0) {
LAB_001cf727:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      bVar13 = -(char)iVar21;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar17 = puVar2 + -4;
      do {
        local_90 = (uint)local_d8;
        puVar35 = puVar38 + 0x10;
        uVar34 = (ulong)((uint)((int)*puVar38 * -0x61c8864f) >> (bVar13 & 0x1f));
        iVar21 = *(int *)((long)puVar38 + 1);
        uVar28 = pUVar5[uVar34];
        uVar14 = (uint)uVar20;
        lVar30 = -uVar20;
        uVar27 = uVar37;
        puVar40 = (ulong *)((long)puVar38 + 1);
        while( true ) {
          puVar18 = puVar16;
          puVar11 = puVar36;
          uVar33 = (ulong)((uint)(iVar21 * -0x61c8864f) >> (bVar13 & 0x1f));
          uVar19 = (int)puVar38 - iVar31;
          iVar21 = *(int *)((long)puVar11 + lVar30);
          pUVar5[uVar34] = uVar19;
          if ((uVar14 != 0) && ((int)*puVar11 == iVar21)) {
            uVar27 = (ulong)(*(char *)((long)puVar11 - 1) == *(char *)((long)puVar11 + lVar30 + -1))
            ;
            puVar38 = (ulong *)((long)puVar11 - uVar27);
            pBVar10 = (BYTE *)((long)puVar11 + (lVar30 - uVar27));
            uVar27 = uVar27 | 4;
            pUVar5[uVar33] = (int)puVar40 - iVar31;
            UVar29 = 1;
            goto LAB_001ce732;
          }
          if ((uVar15 <= uVar28) &&
             (uVar9 = (ulong)uVar28, puVar36 = puVar40, (int)*puVar38 == *(int *)(pBVar6 + uVar9)))
          goto LAB_001ce7dd;
          uVar28 = pUVar5[uVar33];
          uVar9 = (ulong)uVar28;
          uVar34 = (ulong)((uint)((int)*puVar11 * -0x61c8864f) >> (bVar13 & 0x1f));
          uVar19 = (int)puVar40 - iVar31;
          pUVar5[uVar33] = uVar19;
          if ((uVar15 <= uVar28) && ((int)*puVar40 == *(int *)(pBVar6 + uVar9))) break;
          uVar28 = pUVar5[uVar34];
          uVar33 = uVar27;
          if (puVar35 <= (ulong *)((long)puVar11 + uVar27)) {
            puVar35 = puVar35 + 0x10;
            uVar33 = uVar27 + 1;
          }
          iVar21 = (int)*puVar18;
          puVar16 = (ulong *)(uVar27 + (long)puVar18);
          puVar36 = (ulong *)((long)puVar11 + uVar27);
          puVar38 = puVar11;
          uVar27 = uVar33;
          puVar40 = puVar18;
          if (puVar8 <= puVar16) goto LAB_001cf5a2;
        }
        puVar36 = puVar11;
        uVar33 = uVar34;
        puVar38 = puVar40;
        if (uVar27 < 5) {
LAB_001ce7dd:
          pUVar5[uVar33] = (int)puVar36 - iVar31;
        }
        pBVar10 = pBVar6 + uVar9;
        uVar14 = (int)puVar38 - (int)pBVar10;
        if (uVar14 == 0) {
LAB_001cf765:
          __assert_fail("(rep_offset1)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                        ,0x16a,
                        "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        UVar29 = uVar14 + 3;
        uVar27 = 4;
        local_d8 = uVar20;
        if ((uVar15 < uVar28) && (puVar39 < puVar38)) {
          pBVar3 = pBVar6 + (uVar9 - 1);
          puVar36 = puVar38;
          while (pBVar10 = pBVar3, puVar38 = (ulong *)((long)puVar36 + -1),
                *(BYTE *)puVar38 == *pBVar10) {
            uVar27 = uVar27 + 1;
            if ((puVar38 <= puVar39) ||
               (pBVar3 = pBVar10 + -1, puVar36 = puVar38, pBVar10 <= pBVar24)) goto LAB_001ce732;
          }
          pBVar10 = pBVar10 + 1;
          puVar38 = puVar36;
        }
LAB_001ce732:
        puVar36 = (ulong *)((long)puVar38 + uVar27);
        puVar16 = (ulong *)(pBVar10 + uVar27);
        puVar35 = puVar36;
        if (puVar36 < puVar1) {
          if (*puVar16 == *puVar36) {
            lVar30 = 0;
            do {
              puVar16 = (ulong *)((long)puVar38 + lVar30 + uVar27 + 8);
              if (puVar1 <= puVar16) {
                puVar16 = (ulong *)(pBVar10 + lVar30 + uVar27 + 8);
                puVar35 = (ulong *)((long)puVar38 + lVar30 + 8 + uVar27);
                goto LAB_001ce89b;
              }
              lVar25 = lVar30 + uVar27 + 8;
              uVar20 = *puVar16;
              lVar30 = lVar30 + 8;
            } while (*(ulong *)(pBVar10 + lVar25) == uVar20);
            uVar20 = uVar20 ^ *(ulong *)(pBVar10 + lVar25);
            uVar34 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            uVar20 = (uVar34 >> 3 & 0x1fffffff) + lVar30;
          }
          else {
            uVar34 = *puVar36 ^ *puVar16;
            uVar20 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001ce89b:
          if ((puVar35 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar35 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar16 == (short)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar35 < puVar2) {
            puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar16 == (char)*puVar35));
          }
          uVar20 = (long)puVar35 - (long)puVar36;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001cf6ca:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001cf68c:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar34 = (long)puVar38 - (long)puVar39;
        puVar36 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar36 + uVar34)) {
LAB_001cf64e:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar2 < puVar38) {
LAB_001cf66d:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar17 < puVar38) {
          ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar39,(BYTE *)puVar38,(BYTE *)puVar17);
LAB_001ce95e:
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001cf784:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar33 = puVar39[1];
          *puVar36 = *puVar39;
          puVar36[1] = uVar33;
          pBVar10 = seqStore->lit;
          if (0x10 < uVar34) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - (long)(puVar39 + 2)))
               ) {
LAB_001cf7a3:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar33 = puVar39[3];
            *(ulong *)(pBVar10 + 0x10) = puVar39[2];
            *(ulong *)(pBVar10 + 0x18) = uVar33;
            if (0x20 < (long)uVar34) {
              lVar30 = 0;
              do {
                puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x20);
                uVar7 = puVar4[1];
                pBVar3 = pBVar10 + lVar30 + 0x20;
                *(undefined8 *)pBVar3 = *puVar4;
                *(undefined8 *)(pBVar3 + 8) = uVar7;
                puVar4 = (undefined8 *)((long)puVar39 + lVar30 + 0x30);
                uVar7 = puVar4[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar3 + 0x18) = uVar7;
                lVar30 = lVar30 + 0x20;
              } while (pBVar3 + 0x20 < pBVar10 + uVar34);
            }
            goto LAB_001ce95e;
          }
          seqStore->lit = pBVar10 + uVar34;
        }
        uVar20 = uVar20 + uVar27;
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar34;
        psVar12->offBase = UVar29;
        if (uVar20 < 3) {
LAB_001cf6ab:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar20 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001cf6e9:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->mlBase = (U16)(uVar20 - 3);
        psVar12 = psVar12 + 1;
        seqStore->sequences = psVar12;
        puVar39 = (ulong *)((long)puVar38 + uVar20);
        if (puVar39 <= puVar8) {
          if (pBVar6 + (ulong)uVar19 + 2 <= src) {
LAB_001cf746:
            __assert_fail("base+current0+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                          ,0x181,
                          "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          pUVar5[(uint)(*(int *)(pBVar6 + (ulong)uVar19 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
               uVar19 + 2;
          pUVar5[(uint)(*(int *)((long)puVar39 + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
               ((int)puVar39 + -2) - iVar31;
          if ((uint)local_d8 == 0) {
            local_d8 = 0;
          }
          else {
            uVar20 = (ulong)uVar14;
            uVar28 = (uint)local_d8;
            do {
              uVar27 = uVar20;
              uVar19 = (uint)uVar27;
              local_d8 = (ulong)uVar28;
              uVar14 = uVar19;
              if ((int)*puVar39 != *(int *)((long)puVar39 - (ulong)uVar28)) break;
              lVar30 = -(ulong)uVar28;
              puVar38 = (ulong *)((long)puVar39 + 4);
              puVar16 = (ulong *)((long)puVar39 + lVar30 + 4);
              puVar36 = puVar38;
              if (puVar38 < puVar1) {
                if (*puVar16 == *puVar38) {
                  lVar25 = 0;
                  do {
                    puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                    if (puVar1 <= puVar36) {
                      puVar16 = (ulong *)((long)puVar39 + lVar30 + lVar25 + 0xc);
                      puVar36 = (ulong *)((long)puVar39 + lVar25 + 0xc);
                      goto LAB_001ceb7f;
                    }
                    uVar20 = *(ulong *)((long)puVar39 + lVar25 + lVar30 + 0xc);
                    uVar34 = *puVar36;
                    lVar25 = lVar25 + 8;
                  } while (uVar20 == uVar34);
                  uVar34 = uVar34 ^ uVar20;
                  uVar20 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar25;
                }
                else {
                  uVar34 = *puVar38 ^ *puVar16;
                  uVar20 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = uVar20 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001ceb7f:
                if ((puVar36 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar16 == (int)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar16 = (ulong *)((long)puVar16 + 4);
                }
                if ((puVar36 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar16 == (short)*puVar36)
                   ) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar16 = (ulong *)((long)puVar16 + 2);
                }
                if (puVar36 < puVar2) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar16 == (char)*puVar36));
                }
                uVar20 = (long)puVar36 - (long)puVar38;
              }
              pUVar5[(uint)((int)*puVar39 * -0x61c8864f) >> (bVar13 & 0x1f)] = (int)puVar39 - iVar31
              ;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar12 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001cf6ca;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001cf68c;
              puVar38 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cf64e;
              if (puVar2 < puVar39) goto LAB_001cf66d;
              if (puVar17 < puVar39) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar38,(BYTE *)puVar39,(BYTE *)puVar39,(BYTE *)puVar17);
              }
              else {
                uVar34 = puVar39[1];
                *puVar38 = *puVar39;
                puVar38[1] = uVar34;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = 0;
              psVar12->offBase = 1;
              if (uVar20 + 4 < 3) goto LAB_001cf6ab;
              if (0xffff < uVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cf6e9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar39 = (ulong *)((long)puVar39 + uVar20 + 4);
              psVar12->mlBase = (U16)(uVar20 + 1);
              psVar12 = psVar12 + 1;
              seqStore->sequences = psVar12;
              uVar20 = (ulong)uVar28;
              local_d8 = uVar27;
              uVar14 = uVar28;
              uVar28 = uVar19;
            } while (puVar39 <= puVar8);
          }
        }
        local_90 = (uint)local_d8;
        puVar36 = (ulong *)((long)puVar39 + uVar37);
        puVar16 = (ulong *)((long)puVar39 + uVar37 + 1);
        uVar20 = (ulong)uVar14;
        puVar38 = puVar39;
      } while (puVar16 < puVar8);
    }
LAB_001cf5a2:
    if (uVar23 <= uVar22) {
      uVar23 = 0;
    }
    uVar28 = uVar23;
    if (uVar14 != 0) {
      uVar28 = uVar32;
    }
    if (uVar32 <= uVar22) {
      uVar28 = uVar23;
      uVar32 = 0;
    }
    if (uVar14 != 0) {
      uVar32 = uVar14;
    }
  }
  *rep = uVar32;
  if (local_90 != 0) {
    uVar28 = local_90;
  }
LAB_001cf62f:
  rep[1] = uVar28;
  return (long)src + (srcSize - (long)puVar39);
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}